

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O0

level_enum helics::getSpdLogLevel(int helicsLogLevel)

{
  int helicsLogLevel_local;
  undefined4 local_4;
  
  if ((helicsLogLevel < 0x18) && (helicsLogLevel != -10)) {
    if (helicsLogLevel < 0xf) {
      if (helicsLogLevel < 6) {
        if (helicsLogLevel < 3) {
          if (helicsLogLevel == 2) {
            local_4 = info;
          }
          else if (helicsLogLevel < 0) {
            local_4 = critical;
          }
          else {
            local_4 = err;
          }
        }
        else {
          local_4 = warn;
        }
      }
      else {
        local_4 = info;
      }
    }
    else {
      local_4 = debug;
    }
  }
  else {
    local_4 = trace;
  }
  return local_4;
}

Assistant:

static spdlog::level::level_enum getSpdLogLevel(int helicsLogLevel)
{
    if (helicsLogLevel >= LogLevels::TRACE || helicsLogLevel == LogLevels::DUMPLOG) {
        return spdlog::level::trace;
    }
    if (helicsLogLevel >= LogLevels::TIMING) {
        return spdlog::level::debug;
    }
    if (helicsLogLevel >= LogLevels::SUMMARY) {
        return spdlog::level::info;
    }
    if (helicsLogLevel >= LogLevels::WARNING) {
        return spdlog::level::warn;
    }
    if (helicsLogLevel == LogLevels::PROFILING) {
        return spdlog::level::info;
    }
    if (helicsLogLevel >= LogLevels::ERROR_LEVEL) {
        return spdlog::level::err;
    }
    return spdlog::level::critical;
}